

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_tester.cpp
# Opt level: O3

int main(int argc,char **args)

{
  ostream *poVar1;
  char *pcVar2;
  unsigned_long uVar3;
  long *chunk_locations;
  char *pcVar4;
  long *plVar5;
  undefined8 uVar6;
  size_t __n;
  ulong uVar7;
  int x;
  ulong uVar8;
  long lVar9;
  string filename;
  string output_name;
  WrestlerLoader wl;
  ofstream ofile;
  int local_37c;
  char *local_378;
  uint local_36c;
  vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_> local_368;
  char *local_348;
  long local_340;
  char local_338;
  undefined7 uStack_337;
  string local_328;
  undefined1 *local_308;
  char *local_300;
  undefined1 local_2f8;
  undefined7 uStack_2f7;
  ulong local_2e8;
  unsigned_long local_2e0;
  string local_2d8;
  vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_> local_2b8;
  WrestlerLoader local_2a0;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_348 = &local_338;
  local_340 = 0;
  local_338 = '\0';
  local_308 = &local_2f8;
  local_300 = (char *)0x0;
  local_2f8 = 0;
  if (argc < 2) {
    std::__cxx11::string::_M_replace((ulong)&local_348,0,(char *)0x0,0x107050);
  }
  else {
    pcVar2 = args[1];
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&local_348,0,(char *)0x0,(ulong)pcVar2);
    pcVar2 = local_300;
    if (argc != 2) {
      pcVar4 = args[2];
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)&local_308,0,pcVar2,(ulong)pcVar4);
      goto LAB_001047ab;
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_308,0,local_300,0x107059);
LAB_001047ab:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"loading from file ",0x12);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_348,local_340);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_368.
  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.
  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_348,local_348 + local_340);
  fp_remover::loaders::WrestlerLoader::WrestlerLoader(&local_2a0,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(&local_230);
  local_37c = 1;
  do {
    fp_remover::loaders::WrestlerLoader::load(&local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"load succesful",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    local_36c = fp_remover::loaders::WrestlerLoader::get_record_loc(&local_2a0);
    local_2e0 = fp_remover::loaders::WrestlerLoader::get_byte_skip_loc(&local_2a0);
    fp_remover::loaders::WrestlerLoader::get_wrestlers(&local_2b8,&local_2a0);
    local_328.field_2._M_allocated_capacity =
         (size_type)
         local_368.
         super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328._M_string_length =
         (size_type)
         local_368.
         super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_328._M_dataplus._M_p =
         (pointer)local_368.
                  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_368.
    super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2b8.
         super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_368.
    super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_2b8.
         super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_368.
    super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2b8.
         super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2b8.
    super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
    ~vector((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_> *
            )&local_328);
    std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
    ~vector(&local_2b8);
    pcVar2 = fp_remover::loaders::WrestlerLoader::get_file_p(&local_2a0);
    uVar3 = fp_remover::loaders::WrestlerLoader::get_filesize(&local_2a0);
    chunk_locations = fp_remover::loaders::WrestlerLoader::get_chunk_locations(&local_2a0);
    uVar8 = (ulong)(int)uVar3;
    pcVar4 = (char *)operator_new__(uVar8);
    memcpy(pcVar4,pcVar2,uVar8);
    local_378 = pcVar4;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_37c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," - ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHUNK DATA:",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar9 = 0;
    local_2e8 = uVar8;
    do {
      plVar5 = (long *)std::ostream::operator<<
                                 ((ostream *)&std::cout,*(int *)(pcVar4 + chunk_locations[lVar9]));
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x11);
    lVar9 = 0;
    uVar8 = 0;
    do {
      uVar7 = ((long)local_368.
                     super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_368.
                     super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
        uVar6 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar8);
        fp_remover::loaders::WrestlerLoader::~WrestlerLoader(&local_2a0);
        std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
        ~vector(&local_368);
        if (local_308 != &local_2f8) {
          operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
        }
        _Unwind_Resume(uVar6);
      }
      fp_remover::classes::Character::get_name_abi_cxx11_
                (&local_328,
                 (Character *)
                 ((long)&((local_368.
                           super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_Character).
                         character_fp_start + lVar9));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_328._M_dataplus._M_p,
                          local_328._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0xa0;
    } while (uVar8 != 5);
    __n = (size_t)local_36c;
    uVar3 = remove_wrestler(&local_378,&local_368,0,local_36c,local_2e0,local_2e8,chunk_locations);
    pcVar2 = local_378;
    fp_remover::loaders::WrestlerLoader::write
              (&local_2a0,(int)local_378,(void *)(uVar3 & 0xffffffff),__n);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    local_378 = (char *)0x0;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    local_37c = local_37c + 1;
  } while (local_37c != 10);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  fp_remover::loaders::WrestlerLoader::~WrestlerLoader(&local_2a0);
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
  ~vector(&local_368);
  if (local_308 != &local_2f8) {
    operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* args[])
{
	string filename;
	string output_name;
	if(argc > 1) filename = args[1];
	else filename = "savedata";
	if(argc > 2) output_name = args[2];
	else output_name = "output";

	cout << "loading from file " << filename << endl;

	vector<Wrestler> p;
	int wrestler_count_loc, size;
	unsigned long skip_byte_loc;
	const long int *chunk_locations;
	const char* fp;

	{
		WrestlerLoader wl(filename);
		char* fp_m;
		ofstream ofile;
		for(int in = 1; in < 10; in++)
		{

			wl.load();
			cout << "load succesful" << endl; // testing
			wrestler_count_loc = wl.get_record_loc();
			skip_byte_loc = wl.get_byte_skip_loc();
			p = wl.get_wrestlers();
			fp = wl.get_file_p();
			size = wl.get_filesize();
			chunk_locations = wl.get_chunk_locations();

			//cout << "removing " << p.at(in).get_name() << endl; 

			fp_m = new char[size];

			fp_m = (char*) memcpy(fp_m, fp, size);

			cout << in << " - " << "CHUNK DATA:" << endl;
			for( int x = 0; x < NUM_CHUNKS; x++)
			{
				cout << *(int*) &fp_m[chunk_locations[x]] << endl;
			}
			
			//for(auto& x : p) cout << x.get_name() << endl;
			for( int x = 0; x < 5; x++) cout << p.at(x).get_name() << endl;
			// remove wrestler at in input from the user
			size = remove_wrestler(fp_m, p, 0, wrestler_count_loc, skip_byte_loc, size, chunk_locations);

			wl.write(fp_m, size);

			//ofile.open(output_name, ios_base::binary | ios_base::trunc);
			//ofile.write(fp_m, size);
			//ofile.close();
			fp = nullptr;
			delete [] fp_m;
			fp_m = nullptr;
			chunk_locations = nullptr;
			//p.clear();
			cout << endl;
		}

	} // destroy uneeded loader
	return 0;
}